

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  xmlBufferAllocationScheme xVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *extra;
  ulong uVar8;
  
  if (buf == (xmlBufferPtr)0x0) {
    return 0;
  }
  xVar1 = buf->alloc;
  if (xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) {
    return 0;
  }
  uVar2 = buf->size;
  iVar5 = 1;
  if (size < uVar2) {
    return 1;
  }
  if (0xfffffff5 < size) {
    extra = "growing buffer past UINT_MAX";
    goto LAB_00187483;
  }
  switch(xVar1) {
  case XML_BUFFER_ALLOC_DOUBLEIT:
  case XML_BUFFER_ALLOC_IO:
    sVar7 = (size_t)(size + 10);
    if (uVar2 != 0) {
      sVar7 = (size_t)uVar2;
    }
    while (uVar6 = (uint)sVar7, uVar6 < size) {
      if ((int)uVar6 < 0) goto LAB_0018747c;
      sVar7 = (size_t)(uVar6 * 2);
    }
    goto LAB_001873a3;
  case XML_BUFFER_ALLOC_EXACT:
    size = size + 10;
LAB_0018739a:
    sVar7 = (size_t)size;
    break;
  default:
    sVar7 = (size_t)(size + 10);
LAB_001873a3:
    uVar6 = (uint)sVar7;
    if ((xVar1 != XML_BUFFER_ALLOC_IO) || (pxVar4 = buf->contentIO, pxVar4 == (xmlChar *)0x0))
    break;
    uVar8 = (long)buf->content - (long)pxVar4;
    if (uVar8 <= sVar7) {
      pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar7 + uVar8);
      if (pxVar4 == (xmlChar *)0x0) goto LAB_0018747c;
      buf->contentIO = pxVar4;
      pxVar4 = pxVar4 + uVar8;
      goto LAB_00187456;
    }
    memmove(pxVar4,buf->content,(ulong)buf->use);
    buf->content = buf->contentIO;
    buf->contentIO[buf->use] = '\0';
    goto LAB_00187459;
  case XML_BUFFER_ALLOC_HYBRID:
    if (buf->use < 0x1000) goto LAB_0018739a;
    sVar7 = (size_t)uVar2;
    if (uVar2 < size) {
      sVar7 = (size_t)uVar2;
      do {
        if ((int)sVar7 < 0) goto LAB_0018747c;
        uVar6 = (int)sVar7 * 2;
        sVar7 = (size_t)uVar6;
      } while (uVar6 < size);
      goto LAB_001873a3;
    }
  }
  uVar6 = (uint)sVar7;
  if (buf->content == (xmlChar *)0x0) {
    pxVar3 = (xmlChar *)(*xmlMallocAtomic)(sVar7);
    buf->use = 0;
    pxVar4 = pxVar3;
LAB_00187453:
    *pxVar3 = '\0';
LAB_00187456:
    buf->content = pxVar4;
LAB_00187459:
    buf->size = uVar6;
  }
  else {
    if (uVar2 - buf->use < 100) {
      pxVar4 = (xmlChar *)(*xmlRealloc)(buf->content,sVar7);
      if (pxVar4 != (xmlChar *)0x0) goto LAB_00187456;
    }
    else {
      pxVar4 = (xmlChar *)(*xmlMallocAtomic)(sVar7);
      if (pxVar4 != (xmlChar *)0x0) {
        memcpy(pxVar4,buf->content,(ulong)buf->use);
        (*xmlFree)(buf->content);
        pxVar3 = pxVar4 + buf->use;
        goto LAB_00187453;
      }
    }
LAB_0018747c:
    extra = "growing buffer";
LAB_00187483:
    iVar5 = 0;
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,extra);
  }
  return iVar5;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    unsigned int newSize;
    xmlChar* rebuf = NULL;
    size_t start_buf;

    if (buf == NULL)
        return(0);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);

    /* Don't resize if we don't have to */
    if (size < buf->size)
        return 1;

    if (size > UINT_MAX - 10) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return 0;
    }

    /* figure out new size */
    switch (buf->alloc){
	case XML_BUFFER_ALLOC_IO:
	case XML_BUFFER_ALLOC_DOUBLEIT:
	    /*take care of empty case*/
            if (buf->size == 0)
                newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
            else
                newSize = buf->size;
	    while (size > newSize) {
	        if (newSize > UINT_MAX / 2) {
	            xmlTreeErrMemory("growing buffer");
	            return 0;
	        }
	        newSize *= 2;
	    }
	    break;
	case XML_BUFFER_ALLOC_EXACT:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
        case XML_BUFFER_ALLOC_HYBRID:
            if (buf->use < BASE_BUFFER_SIZE)
                newSize = size;
            else {
                newSize = buf->size;
                while (size > newSize) {
                    if (newSize > UINT_MAX / 2) {
                        xmlTreeErrMemory("growing buffer");
                        return 0;
                    }
                    newSize *= 2;
                }
            }
            break;

	default:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        start_buf = buf->content - buf->contentIO;

        if (start_buf > newSize) {
	    /* move data back to start */
	    memmove(buf->contentIO, buf->content, buf->use);
	    buf->content = buf->contentIO;
	    buf->content[buf->use] = 0;
	    buf->size += start_buf;
	} else {
	    rebuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + newSize);
	    if (rebuf == NULL) {
		xmlTreeErrMemory("growing buffer");
		return 0;
	    }
	    buf->contentIO = rebuf;
	    buf->content = rebuf + start_buf;
	}
    } else {
	if (buf->content == NULL) {
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    buf->use = 0;
	    rebuf[buf->use] = 0;
	} else if (buf->size - buf->use < 100) {
	    rebuf = (xmlChar *) xmlRealloc(buf->content, newSize);
        } else {
	    /*
	     * if we are reallocating a buffer far from being full, it's
	     * better to make a new allocation and copy only the used range
	     * and free the old one.
	     */
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    if (rebuf != NULL) {
		memcpy(rebuf, buf->content, buf->use);
		xmlFree(buf->content);
		rebuf[buf->use] = 0;
	    }
	}
	if (rebuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return 0;
	}
	buf->content = rebuf;
    }
    buf->size = newSize;

    return 1;
}